

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O2

void renderScene(void)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  float in_XMM0_Da;
  
  loadSphereDataBuffers(in_XMM0_Da);
  if (g_framebuffer.flags.progressive == true) {
    renderSceneProgressive();
    return;
  }
  iVar1 = g_framebuffer.samplesPerPixel / g_framebuffer.samplesPerPass +
          (uint)(g_framebuffer.samplesPerPixel / g_framebuffer.samplesPerPass == 0);
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    loadRandomBuffer();
    renderSceneProgressive();
  }
  return;
}

Assistant:

void renderScene()
{
    loadSphereDataBuffers(1.f);
    if (g_framebuffer.flags.progressive) {
        renderSceneProgressive();
    } else {
        int passCnt = g_framebuffer.samplesPerPixel
                    / g_framebuffer.samplesPerPass;

        if (!passCnt) passCnt = 1;
        for (int i = 0; i < passCnt; ++i) {
            loadRandomBuffer();
            renderSceneProgressive();
        }
    }
}